

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError> * __thiscall
kj::_::PromiseAwaiter<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::await_resume
          (OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError> *__return_storage_ptr__,
          PromiseAwaiter<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *this)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  anon_union_64_1_a8c68091_for_NullableValue<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>_2
  *paVar7;
  void *unaff_retaddr;
  
  PromiseAwaiterBase::awaitResumeImpl
            (&this->super_PromiseAwaiterBase,&(this->result).super_ExceptionOrValue,unaff_retaddr);
  paVar7 = (anon_union_64_1_a8c68091_for_NullableValue<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>_2
            *)0x0;
  if ((this->result).value.ptr.isSet != false) {
    paVar7 = &(this->result).value.ptr.field_1;
  }
  uVar1 = (paVar7->value).tag;
  __return_storage_ptr__->tag = uVar1;
  if (uVar1 == 2) {
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) =
         *(undefined8 *)((long)paVar7 + 0x38);
    uVar2 = *(undefined8 *)((long)paVar7 + 8);
    uVar3 = *(undefined8 *)((long)paVar7 + 0x10);
    uVar4 = *(undefined8 *)((long)paVar7 + 0x18);
    uVar5 = *(undefined8 *)((long)paVar7 + 0x20);
    uVar6 = *(undefined8 *)((long)paVar7 + 0x30);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) =
         *(undefined8 *)((long)paVar7 + 0x28);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = uVar6;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = uVar4;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x18) = uVar5;
    *(undefined8 *)&__return_storage_ptr__->field_1 = uVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = uVar3;
  }
  else if (uVar1 == 1) {
    *(undefined8 *)&__return_storage_ptr__->field_1 = *(undefined8 *)((long)paVar7 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

KJ_NOINLINE T await_resume() {
    // This is marked noinline in order to ensure __builtin_return_address() is accurate for stack
    // trace purposes. In my experimentation, this method was not inlined anyway even in opt
    // builds, but I want to make sure it doesn't suddenly start being inlined later causing stack
    // traces to break. (I also tried always-inline, but this did not appear to cause the compiler
    // to inline the method -- perhaps a limitation of coroutines?)
#if __GNUC__
    awaitResumeImpl(result, __builtin_return_address(0));
#elif _MSC_VER
    awaitResumeImpl(result, _ReturnAddress());
#else
    #error "please implement for your compiler"
#endif
    auto value = kj::_::readMaybe(result.value);
    KJ_IASSERT(value != nullptr, "Neither exception nor value present.");
    return T(kj::mv(*value));
  }